

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdash_reporter.c
# Opt level: O3

void cdash_reporter_start_test(TestReporter *reporter,char *name)

{
  void *pvVar1;
  time_t t1;
  tm d1;
  time_t local_60;
  tm local_58;
  
  pvVar1 = reporter->memo;
  local_60 = time((time_t *)0x0);
  gmtime_r(&local_60,&local_58);
  *(time_t *)((long)pvVar1 + 0x38) = local_60;
  reporter_start_test(reporter,name);
  return;
}

Assistant:

static void cdash_reporter_start_test(TestReporter *reporter, const char *name) {
    CDashMemo *memo = (CDashMemo *)reporter->memo;

    memo->teststarted = cdash_current_time(NULL);
    reporter_start_test(reporter, name);
}